

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_cmap10_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  
  if (valid->limit < table + 0x14) {
    ft_validator_error(valid,8);
  }
  uVar6 = *(uint *)(table + 4);
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  bVar1 = table[0x10];
  bVar2 = table[0x11];
  bVar3 = table[0x12];
  bVar4 = table[0x13];
  if (((uVar6 < 0x14) || ((ulong)((long)valid->limit - (long)table) < (ulong)uVar6)) ||
     ((ulong)uVar6 - 0x14 >> 1 <
      ((ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 | (ulong)bVar3 * 0x100 | (ulong)bVar4))) {
    ft_validator_error(valid,8);
  }
  if (valid->level != FT_VALIDATE_DEFAULT) {
    for (lVar7 = 0;
        lVar7 != (ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 +
                 (ulong)bVar4 + (ulong)bVar3 * 0x100; lVar7 = lVar7 + 1) {
      uVar5 = *(ushort *)(table + 0x14 + lVar7 * 2);
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar5 << 8 | uVar5 >> 8)) {
        ft_validator_error(valid,0x10);
      }
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap10_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p = table + 4;
    FT_ULong  length, count;


    if ( table + 20 > valid->limit )
      FT_INVALID_TOO_SHORT;

    length = TT_NEXT_ULONG( p );
    p      = table + 16;
    count  = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 20 + count * 2 ? */
         length < 20                                 ||
         ( length - 20 ) / 2 < count                 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  gindex;


      for ( ; count > 0; count-- )
      {
        gindex = TT_NEXT_USHORT( p );
        if ( gindex >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }